

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O0

void __thiscall
tcu::ThreadUtil::DataBlock::DataBlock(DataBlock *this,SharedPtr<tcu::ThreadUtil::Event> *event)

{
  SharedPtr<tcu::ThreadUtil::Event> local_28;
  SharedPtr<tcu::ThreadUtil::Event> *local_18;
  SharedPtr<tcu::ThreadUtil::Event> *event_local;
  DataBlock *this_local;
  
  local_18 = event;
  event_local = (SharedPtr<tcu::ThreadUtil::Event> *)this;
  de::SharedPtr<tcu::ThreadUtil::Event>::SharedPtr(&local_28,event);
  Object::Object(&this->super_Object,"DataBlock",&local_28);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_28);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__DataBlock_0067bdb0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_data);
  return;
}

Assistant:

DataBlock::DataBlock (SharedPtr<Event> event)
	: Object("DataBlock", event)
{
}